

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O1

FT_Error tt_face_vary_cvt(TT_Face face,FT_Stream stream)

{
  FT_Memory memory;
  FT_Short *pFVar1;
  FT_UShort FVar2;
  FT_UShort FVar3;
  int iVar4;
  FT_ULong FVar5;
  FT_Fixed *im_end_coords;
  FT_UShort *P;
  uchar *puVar6;
  FT_Fixed FVar7;
  FT_Short *P_00;
  uchar *puVar8;
  uint uVar9;
  FT_UInt delta_cnt;
  FT_Short *pFVar10;
  FT_Fixed *pFVar11;
  ulong uVar12;
  FT_Fixed *pFVar13;
  FT_Error error;
  FT_UInt spoint_count;
  FT_UInt point_count;
  FT_ULong table_len;
  FT_Error local_b4;
  GX_Blend local_b0;
  FT_UShort local_a2;
  FT_Fixed *local_a0;
  FT_Short *local_98;
  FT_Fixed *local_90;
  ulong local_88;
  FT_UInt local_80;
  uint local_7c;
  FT_UShort *local_78;
  FT_ULong local_70;
  FT_Fixed *local_68;
  FT_Fixed local_60;
  ulong local_58;
  FT_UShort *local_50;
  uchar *local_48;
  uchar *local_40;
  ulong local_38;
  
  memory = stream->memory;
  local_b0 = face->blend;
  local_80 = 0;
  if ((((local_b0 == (GX_Blend)0x0) || (face->cvt == (FT_Short *)0x0)) ||
      (local_b4 = (*face->goto_table)(face,0x63766172,stream,&local_70), local_b4 != 0)) ||
     (local_b4 = FT_Stream_EnterFrame(stream,local_70), local_b4 != 0)) {
    local_b4 = 0;
    im_end_coords = (FT_Fixed *)0x0;
    P = (FT_UShort *)0x0;
    pFVar11 = (FT_Fixed *)0x0;
    pFVar13 = (FT_Fixed *)0x0;
    goto LAB_0016e6ff;
  }
  puVar8 = stream->cursor;
  puVar6 = stream->base;
  FVar5 = FT_Stream_GetULong(stream);
  if (FVar5 == 0x10000) {
    local_88 = (long)puVar8 - (long)puVar6;
    local_a0 = (FT_Fixed *)
               ft_mem_realloc(memory,8,0,(ulong)local_b0->num_axis,(void *)0x0,&local_b4);
    if (local_b4 == 0) {
      im_end_coords = (FT_Fixed *)0x0;
      local_90 = (FT_Fixed *)
                 ft_mem_realloc(memory,8,0,(ulong)local_b0->num_axis,(void *)0x0,&local_b4);
      if (local_b4 == 0) {
        P = (FT_UShort *)0x0;
        im_end_coords =
             (FT_Fixed *)ft_mem_realloc(memory,8,0,(ulong)local_b0->num_axis,(void *)0x0,&local_b4);
        pFVar11 = local_90;
        pFVar13 = local_a0;
        if (local_b4 == 0) {
          FVar2 = FT_Stream_GetUShort(stream);
          FVar3 = FT_Stream_GetUShort(stream);
          local_58 = (ulong)(FVar2 & 0xfff);
          if (local_70 < (ulong)FVar3 + local_58 * 4) {
            local_b4 = 8;
            goto LAB_0016e7e7;
          }
          local_88 = local_88 + FVar3;
          local_68 = im_end_coords;
          if ((short)FVar2 < 0) {
            puVar8 = stream->base;
            uVar12 = (long)stream->cursor - (long)puVar8;
            puVar6 = puVar8 + local_88;
            if ((ulong)((long)stream->limit - (long)puVar8) <= local_88) {
              puVar6 = stream->limit;
            }
            stream->cursor = puVar6;
            P = ft_var_readpackedpoints(stream,local_70,&local_80);
            puVar8 = stream->base;
            local_88 = (long)stream->cursor - (long)puVar8;
            puVar6 = puVar8 + uVar12;
            if ((ulong)((long)stream->limit - (long)puVar8) <= uVar12) {
              puVar6 = stream->limit;
            }
            stream->cursor = puVar6;
          }
          else {
            P = (FT_UShort *)0x0;
          }
          pFVar11 = local_90;
          im_end_coords = local_68;
          pFVar13 = local_a0;
          if ((uint)local_58 != 0) {
            uVar12 = 0;
            local_78 = (FT_UShort *)0x0;
            do {
              local_38 = uVar12;
              local_a2 = FT_Stream_GetUShort(stream);
              FVar2 = FT_Stream_GetUShort(stream);
              pFVar11 = local_a0;
              uVar9 = (uint)FVar2;
              if ((short)FVar2 < 0) {
                local_98 = (FT_Short *)CONCAT44(local_98._4_4_,uVar9);
                if (local_b0->num_axis != 0) {
                  uVar12 = 0;
                  do {
                    FVar2 = FT_Stream_GetUShort(stream);
                    pFVar11[uVar12] = (long)((int)(short)FVar2 << 2);
                    uVar12 = uVar12 + 1;
                  } while (uVar12 < local_b0->num_axis);
                }
LAB_0016e995:
                im_end_coords = local_68;
                if (((uint)local_98 >> 0xe & 1) != 0) {
                  if (local_b0->num_axis != 0) {
                    uVar12 = 0;
                    do {
                      FVar2 = FT_Stream_GetUShort(stream);
                      local_90[uVar12] = (long)((int)(short)FVar2 << 2);
                      uVar12 = uVar12 + 1;
                    } while (uVar12 < local_b0->num_axis);
                  }
                  im_end_coords = local_68;
                  if (local_b0->num_axis != 0) {
                    uVar12 = 0;
                    do {
                      FVar2 = FT_Stream_GetUShort(stream);
                      im_end_coords[uVar12] = (long)((int)(short)FVar2 << 2);
                      uVar12 = uVar12 + 1;
                    } while (uVar12 < local_b0->num_axis);
                  }
                }
                uVar9 = (uint)local_98;
                FVar7 = ft_var_apply_tuple(local_b0,(FT_UShort)local_98,local_a0,local_90,
                                           im_end_coords);
                if (FVar7 == 0) {
                  local_88 = local_88 + local_a2;
                  iVar4 = 0x16;
                }
                else {
                  local_48 = stream->base;
                  local_40 = stream->cursor;
                  puVar8 = local_48 + local_88;
                  if ((ulong)((long)stream->limit - (long)local_48) <= local_88) {
                    puVar8 = stream->limit;
                  }
                  stream->cursor = puVar8;
                  local_60 = FVar7;
                  if ((uVar9 >> 0xd & 1) == 0) {
                    local_7c = local_80;
                    local_50 = P;
                  }
                  else {
                    local_50 = ft_var_readpackedpoints(stream,local_70,&local_7c);
                    local_78 = local_50;
                  }
                  local_98 = (FT_Short *)(ulong)local_7c;
                  delta_cnt = local_7c;
                  if (local_98 == (FT_Short *)0x0) {
                    delta_cnt = (FT_UInt)face->cvt_size;
                  }
                  P_00 = ft_var_readpackeddeltas(stream,local_70,delta_cnt);
                  if ((local_50 != (FT_UShort *)0x0) && (P_00 != (FT_Short *)0x0)) {
                    if (local_78 == (FT_UShort *)0xffffffffffffffff) {
                      pFVar10 = (FT_Short *)face->cvt_size;
                      if (pFVar10 != (FT_Short *)0x0 && pFVar10 == local_98) {
                        pFVar1 = face->cvt;
                        uVar12 = 0;
                        do {
                          pFVar1[uVar12] =
                               pFVar1[uVar12] +
                               (short)((uint)((int)((long)P_00[uVar12] * (long)(int)local_60) +
                                              (int)((long)P_00[uVar12] * (long)(int)local_60 >> 0x3f
                                                   ) + 0x8000) >> 0x10);
                          uVar12 = uVar12 + 1;
                        } while ((FT_Short *)(uVar12 & 0xffffffff) < pFVar10);
                      }
                    }
                    else if ((uint)local_98 != 0) {
                      uVar12 = face->cvt_size;
                      pFVar10 = (FT_Short *)0x0;
                      do {
                        if (local_50[(long)pFVar10] < uVar12) {
                          face->cvt[local_50[(long)pFVar10]] =
                               face->cvt[local_50[(long)pFVar10]] +
                               (short)((uint)((int)((long)P_00[(long)pFVar10] * (long)(int)local_60)
                                              + (int)((long)P_00[(long)pFVar10] *
                                                      (long)(int)local_60 >> 0x3f) + 0x8000) >> 0x10
                                      );
                        }
                        pFVar10 = (FT_Short *)((long)pFVar10 + 1);
                      } while (local_98 != pFVar10);
                    }
                  }
                  if (local_78 == (FT_UShort *)0xffffffffffffffff) {
                    local_78 = (FT_UShort *)0xffffffffffffffff;
                  }
                  else {
                    local_98 = P_00;
                    ft_mem_free(memory,local_78);
                    local_78 = (FT_UShort *)0x0;
                    P_00 = local_98;
                  }
                  uVar12 = (long)local_40 - (long)local_48;
                  ft_mem_free(memory,P_00);
                  local_88 = local_88 + local_a2;
                  puVar8 = stream->base + uVar12;
                  if ((ulong)((long)stream->limit - (long)stream->base) <= uVar12) {
                    puVar8 = stream->limit;
                  }
                  stream->cursor = puVar8;
                  iVar4 = 0;
                }
              }
              else {
                if ((uVar9 & 0xfff) < local_b0->tuplecount) {
                  local_98 = (FT_Short *)CONCAT44(local_98._4_4_,uVar9);
                  memcpy(local_a0,local_b0->tuplecoords + (uVar9 & 0xfff) * local_b0->num_axis,
                         (ulong)local_b0->num_axis << 3);
                  goto LAB_0016e995;
                }
                local_b4 = 8;
                iVar4 = 6;
              }
              pFVar11 = local_90;
              pFVar13 = local_a0;
              if ((iVar4 != 0) && (iVar4 != 0x16)) {
                if (iVar4 != 6) {
                  return iVar4;
                }
                goto LAB_0016e6ff;
              }
              uVar9 = (int)local_38 + 1;
              uVar12 = (ulong)uVar9;
            } while (uVar9 != (uint)local_58);
          }
        }
      }
      else {
LAB_0016e7e7:
        P = (FT_UShort *)0x0;
        pFVar11 = local_90;
        pFVar13 = local_a0;
      }
    }
    else {
      P = (FT_UShort *)0x0;
      pFVar11 = (FT_Fixed *)0x0;
      im_end_coords = (FT_Fixed *)0x0;
      pFVar13 = local_a0;
    }
  }
  else {
    local_b4 = 0;
    P = (FT_UShort *)0x0;
    pFVar11 = (FT_Fixed *)0x0;
    im_end_coords = (FT_Fixed *)0x0;
    pFVar13 = (FT_Fixed *)0x0;
  }
  FT_Stream_ExitFrame(stream);
LAB_0016e6ff:
  if (P != (FT_UShort *)0xffffffffffffffff) {
    ft_mem_free(memory,P);
  }
  ft_mem_free(memory,pFVar13);
  ft_mem_free(memory,pFVar11);
  ft_mem_free(memory,im_end_coords);
  return local_b4;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_vary_cvt( TT_Face    face,
                    FT_Stream  stream )
  {
    FT_Error    error;
    FT_Memory   memory = stream->memory;
    FT_ULong    table_start;
    FT_ULong    table_len;
    FT_UInt     tupleCount;
    FT_ULong    offsetToData;
    FT_ULong    here;
    FT_UInt     i, j;
    FT_Fixed*   tuple_coords    = NULL;
    FT_Fixed*   im_start_coords = NULL;
    FT_Fixed*   im_end_coords   = NULL;
    GX_Blend    blend           = face->blend;
    FT_UInt     point_count, spoint_count = 0;
    FT_UShort*  sharedpoints = NULL;
    FT_UShort*  localpoints  = NULL;
    FT_UShort*  points;
    FT_Short*   deltas;


    FT_TRACE2(( "CVAR " ));

    if ( !blend )
    {
      FT_TRACE2(( "\n"
                  "tt_face_vary_cvt: no blend specified\n" ));
      error = FT_Err_Ok;
      goto Exit;
    }

    if ( !face->cvt )
    {
      FT_TRACE2(( "\n"
                  "tt_face_vary_cvt: no `cvt ' table\n" ));
      error = FT_Err_Ok;
      goto Exit;
    }

    error = face->goto_table( face, TTAG_cvar, stream, &table_len );
    if ( error )
    {
      FT_TRACE2(( "is missing\n" ));

      error = FT_Err_Ok;
      goto Exit;
    }

    if ( FT_FRAME_ENTER( table_len ) )
    {
      error = FT_Err_Ok;
      goto Exit;
    }

    table_start = FT_Stream_FTell( stream );
    if ( FT_GET_LONG() != 0x00010000L )
    {
      FT_TRACE2(( "bad table version\n" ));

      error = FT_Err_Ok;
      goto FExit;
    }

    FT_TRACE2(( "loaded\n" ));

    if ( FT_NEW_ARRAY( tuple_coords, blend->num_axis )    ||
         FT_NEW_ARRAY( im_start_coords, blend->num_axis ) ||
         FT_NEW_ARRAY( im_end_coords, blend->num_axis )   )
      goto FExit;

    tupleCount   = FT_GET_USHORT();
    offsetToData = FT_GET_USHORT();

    /* rough sanity test */
    if ( offsetToData + ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) * 4 >
           table_len )
    {
      FT_TRACE2(( "tt_face_vary_cvt:"
                  " invalid CVT variation array header\n" ));

      error = FT_THROW( Invalid_Table );
      goto FExit;
    }

    offsetToData += table_start;

    if ( tupleCount & GX_TC_TUPLES_SHARE_POINT_NUMBERS )
    {
      here = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, offsetToData );

      sharedpoints = ft_var_readpackedpoints( stream,
                                              table_len,
                                              &spoint_count );
      offsetToData = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, here );
    }

    FT_TRACE5(( "cvar: there %s %d tuple%s:\n",
                ( tupleCount & 0xFFF ) == 1 ? "is" : "are",
                tupleCount & 0xFFF,
                ( tupleCount & 0xFFF ) == 1 ? "" : "s" ));

    for ( i = 0; i < ( tupleCount & 0xFFF ); i++ )
    {
      FT_UInt   tupleDataSize;
      FT_UInt   tupleIndex;
      FT_Fixed  apply;


      FT_TRACE6(( "  tuple %d:\n", i ));

      tupleDataSize = FT_GET_USHORT();
      tupleIndex    = FT_GET_USHORT();

      if ( tupleIndex & GX_TI_EMBEDDED_TUPLE_COORD )
      {
        for ( j = 0; j < blend->num_axis; j++ )
          tuple_coords[j] = FT_GET_SHORT() * 4;  /* convert from        */
                                                 /* short frac to fixed */
      }
      else if ( ( tupleIndex & GX_TI_TUPLE_INDEX_MASK ) >= blend->tuplecount )
      {
        FT_TRACE2(( "tt_face_vary_cvt:"
                    " invalid tuple index\n" ));

        error = FT_THROW( Invalid_Table );
        goto Exit;
      }
      else
        FT_MEM_COPY(
          tuple_coords,
          &blend->tuplecoords[( tupleIndex & 0xFFF ) * blend->num_axis],
          blend->num_axis * sizeof ( FT_Fixed ) );

      if ( tupleIndex & GX_TI_INTERMEDIATE_TUPLE )
      {
        for ( j = 0; j < blend->num_axis; j++ )
          im_start_coords[j] = FT_GET_SHORT() * 4;
        for ( j = 0; j < blend->num_axis; j++ )
          im_end_coords[j] = FT_GET_SHORT() * 4;
      }

      apply = ft_var_apply_tuple( blend,
                                  (FT_UShort)tupleIndex,
                                  tuple_coords,
                                  im_start_coords,
                                  im_end_coords );

      if ( apply == 0 )              /* tuple isn't active for our blend */
      {
        offsetToData += tupleDataSize;
        continue;
      }

      here = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, offsetToData );

      if ( tupleIndex & GX_TI_PRIVATE_POINT_NUMBERS )
      {
        localpoints = ft_var_readpackedpoints( stream,
                                               table_len,
                                               &point_count );
        points      = localpoints;
      }
      else
      {
        points      = sharedpoints;
        point_count = spoint_count;
      }

      deltas = ft_var_readpackeddeltas( stream,
                                        table_len,
                                        point_count == 0 ? face->cvt_size
                                                         : point_count );

      if ( !points                                                        ||
           !deltas                                                        ||
           ( localpoints == ALL_POINTS && point_count != face->cvt_size ) )
        ; /* failure, ignore it */

      else if ( localpoints == ALL_POINTS )
      {
#ifdef FT_DEBUG_LEVEL_TRACE
        int  count = 0;
#endif


        FT_TRACE7(( "    CVT deltas:\n" ));

        /* this means that there are deltas for every entry in cvt */
        for ( j = 0; j < face->cvt_size; j++ )
        {
          FT_Long  orig_cvt = face->cvt[j];


          face->cvt[j] = (FT_Short)( orig_cvt +
                                     FT_MulFix( deltas[j], apply ) );

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( orig_cvt != face->cvt[j] )
          {
            FT_TRACE7(( "      %d: %d -> %d\n",
                        j, orig_cvt, face->cvt[j] ));
            count++;
          }
#endif
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( !count )
          FT_TRACE7(( "      none\n" ));
#endif
      }

      else
      {
#ifdef FT_DEBUG_LEVEL_TRACE
        int  count = 0;
#endif


        FT_TRACE7(( "    CVT deltas:\n" ));

        for ( j = 0; j < point_count; j++ )
        {
          int      pindex;
          FT_Long  orig_cvt;


          pindex = points[j];
          if ( (FT_ULong)pindex >= face->cvt_size )
            continue;

          orig_cvt          = face->cvt[pindex];
          face->cvt[pindex] = (FT_Short)( orig_cvt +
                                          FT_MulFix( deltas[j], apply ) );

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( orig_cvt != face->cvt[pindex] )
          {
            FT_TRACE7(( "      %d: %d -> %d\n",
                        pindex, orig_cvt, face->cvt[pindex] ));
            count++;
          }
#endif
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( !count )
          FT_TRACE7(( "      none\n" ));
#endif
      }

      if ( localpoints != ALL_POINTS )
        FT_FREE( localpoints );
      FT_FREE( deltas );

      offsetToData += tupleDataSize;

      FT_Stream_SeekSet( stream, here );
    }

    FT_TRACE5(( "\n" ));

  FExit:
    FT_FRAME_EXIT();

  Exit:
    if ( sharedpoints != ALL_POINTS )
      FT_FREE( sharedpoints );
    FT_FREE( tuple_coords );
    FT_FREE( im_start_coords );
    FT_FREE( im_end_coords );

    return error;
  }